

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

bool __thiscall Catch::TestSpecParser::isControlChar(TestSpecParser *this,char c)

{
  bool local_21;
  char c_local;
  TestSpecParser *this_local;
  bool local_1;
  
  switch(this->m_mode) {
  case None:
    local_1 = c == '~';
    break;
  case Name:
    local_1 = c == '[';
    break;
  case QuotedName:
    local_1 = c == '\"';
    break;
  case Tag:
    local_21 = c == '[' || c == ']';
    local_1 = local_21;
    break;
  case EscapedName:
    local_1 = true;
    break;
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool TestSpecParser::isControlChar( char c ) const {
        switch( m_mode ) {
            default:
                return false;
            case None:
                return c == '~';
            case Name:
                return c == '[';
            case EscapedName:
                return true;
            case QuotedName:
                return c == '"';
            case Tag:
                return c == '[' || c == ']';
        }
    }